

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

void tinyfd_beep(void)

{
  int iVar1;
  FILE *__stream;
  FILE *lIn;
  char lDialogString [256];
  
  iVar1 = osascriptPresent();
  if (iVar1 == 0) {
    iVar1 = pactlPresent();
    if (iVar1 == 0) {
      iVar1 = speakertestPresent();
      if (iVar1 == 0) {
        iVar1 = beepexePresent();
        if (iVar1 == 0) {
          strcpy((char *)&lIn,"printf \'\a\' > /dev/tty");
        }
        else {
          strcpy((char *)&lIn,"beep.exe 440 300");
        }
      }
      else {
        strcpy((char *)&lIn,
               "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .3; kill -9 $pid");
      }
    }
    else {
      __sysv_signal(2,sigHandler);
      strcpy((char *)&lIn,
             "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum"
            );
    }
  }
  else {
    iVar1 = afplayPresent();
    if (iVar1 < 2) {
      strcpy((char *)&lIn,"osascript -e \'tell application \"System Events\" to beep\'");
    }
    else {
      strcpy((char *)&lIn,"afplay /System/Library/Sounds/Ping.aiff");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",&lIn);
  }
  __stream = popen((char *)&lIn,"r");
  if (__stream != (FILE *)0x0) {
    pclose(__stream);
  }
  iVar1 = pactlPresent();
  if (iVar1 != 0) {
    __sysv_signal(2,(__sighandler_t)0x0);
  }
  return;
}

Assistant:

void tinyfd_beep()
{
        char lDialogString [256] ;
        FILE * lIn ;

        if ( osascriptPresent() )
        {
                if ( afplayPresent() >= 2 )
                {
                        strcpy( lDialogString , "afplay /System/Library/Sounds/Ping.aiff") ;
                }
                else
                {
                        strcpy( lDialogString , "osascript -e 'tell application \"System Events\" to beep'") ;
                }
        }
        else if ( pactlPresent() ) 
        {
                signal(SIGINT, sigHandler);
                /*strcpy( lDialogString , "pactl load-module module-sine frequency=440;sleep .3;pactl unload-module module-sine" ) ;*/
                strcpy( lDialogString , "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum" ) ;
        }
        else if ( speakertestPresent() ) 
        {
                /*strcpy( lDialogString , "timeout -k .3 .3 speaker-test --frequency 440 --test sine > /dev/tty" ) ;*/
                strcpy( lDialogString , "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .3; kill -9 $pid" ) ;
        }
        else if ( beepexePresent() ) 
        {
                strcpy( lDialogString , "beep.exe 440 300" ) ;
        }
        else
        {
                strcpy( lDialogString , "printf '\a' > /dev/tty" ) ;
        }

        if (tinyfd_verbose) printf( "lDialogString: %s\n" , lDialogString ) ;

        if ( ( lIn = popen( lDialogString , "r" ) ) )
        {
                pclose( lIn ) ;
        }

        if ( pactlPresent() )
        {
                signal(SIGINT, SIG_DFL);
        }
}